

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

UBool ufmt_isNumeric_63(UFormattable *fmt)

{
  UBool UVar1;
  
  UVar1 = (UBool)(0x10000010100 >> ((char)*(uint *)(fmt + 5) * '\b' & 0x3fU));
  if (5 < *(uint *)(fmt + 5)) {
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
Formattable::isNumeric() const {
    switch (fType) {
    case kDouble:
    case kLong:
    case kInt64:
        return TRUE;
    default:
        return FALSE;
    }
}